

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

Symbol __thiscall
google::protobuf::DescriptorBuilder::FindSymbolNotEnforcingDepsHelper
          (DescriptorBuilder *this,DescriptorPool *pool,string *name)

{
  Tables *pTVar1;
  char *pcVar2;
  _Node **pp_Var3;
  ulong uVar4;
  string *name_00;
  bool bVar5;
  int iVar6;
  Type TVar7;
  ulong uVar8;
  Symbol *pSVar9;
  char cVar10;
  _Node *p_Var12;
  char *pcVar13;
  _Node *p_Var14;
  Symbol SVar15;
  MutexLockMaybe lock;
  MutexLockMaybe local_48;
  DescriptorBuilder *local_40;
  string *local_38;
  anon_union_8_7_bfa3a334_for_Symbol_2 aVar11;
  
  if (this->pool_ == pool) {
    local_48.mu_ = (Mutex *)0x0;
  }
  else {
    local_48.mu_ = pool->mutex_;
  }
  if (local_48.mu_ != (Mutex *)0x0) {
    internal::Mutex::Lock(local_48.mu_);
  }
  pTVar1 = (pool->tables_).ptr_;
  if (pTVar1 != (Tables *)0x0) {
    pcVar2 = (name->_M_dataplus)._M_p;
    cVar10 = *pcVar2;
    if (cVar10 == '\0') {
      uVar8 = 0;
    }
    else {
      uVar8 = 0;
      pcVar13 = pcVar2;
      do {
        pcVar13 = pcVar13 + 1;
        uVar8 = (long)cVar10 + uVar8 * 5;
        cVar10 = *pcVar13;
      } while (cVar10 != '\0');
    }
    pp_Var3 = (pTVar1->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_buckets;
    uVar4 = (pTVar1->symbols_by_name_).
            super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
            .
            super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
            .
            super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
            ._M_bucket_count;
    p_Var12 = pp_Var3[uVar8 % uVar4];
    p_Var14 = (_Node *)0x0;
    local_40 = this;
    local_38 = name;
    if (p_Var12 != (_Node *)0x0) {
      do {
        iVar6 = strcmp(pcVar2,(p_Var12->_M_v).first);
        p_Var14 = p_Var12;
        if (iVar6 == 0) break;
        p_Var12 = p_Var12->_M_next;
        p_Var14 = (_Node *)0x0;
      } while (p_Var12 !=
               (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                *)0x0);
    }
    name_00 = local_38;
    if (p_Var14 == (_Node *)0x0) {
      p_Var14 = pp_Var3[uVar4];
    }
    pSVar9 = &(p_Var14->_M_v).second;
    if (p_Var14 == pp_Var3[uVar4]) {
      pSVar9 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
    }
    aVar11 = (anon_union_8_7_bfa3a334_for_Symbol_2)(pSVar9->field_1).descriptor;
    TVar7 = pSVar9->type;
    if ((TVar7 == NULL_SYMBOL) && (pool->underlay_ != (DescriptorPool *)0x0)) {
      SVar15 = FindSymbolNotEnforcingDepsHelper(local_40,pool->underlay_,local_38);
      aVar11 = SVar15.field_1;
      TVar7 = SVar15.type;
    }
    if ((TVar7 == NULL_SYMBOL) &&
       (bVar5 = DescriptorPool::TryFindSymbolInFallbackDatabase(pool,name_00), bVar5)) {
      pTVar1 = (pool->tables_).ptr_;
      if (pTVar1 == (Tables *)0x0) goto LAB_001df4e9;
      pcVar2 = (name_00->_M_dataplus)._M_p;
      cVar10 = *pcVar2;
      if (cVar10 == '\0') {
        uVar8 = 0;
      }
      else {
        uVar8 = 0;
        pcVar13 = pcVar2;
        do {
          pcVar13 = pcVar13 + 1;
          uVar8 = (long)cVar10 + uVar8 * 5;
          cVar10 = *pcVar13;
        } while (cVar10 != '\0');
      }
      pp_Var3 = (pTVar1->symbols_by_name_).
                super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
                .
                super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
                .
                super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
                ._M_buckets;
      uVar4 = (pTVar1->symbols_by_name_).
              super_unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>_>
              .
              super___unordered_map<const_char_*,_google::protobuf::(anonymous_namespace)::Symbol,_google::protobuf::hash<const_char_*>,_google::protobuf::streq,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_false>
              .
              super__Hashtable<const_char_*,_std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_std::allocator<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_std::_Select1st<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>_>,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::tr1::__detail::_Mod_range_hashing,_std::tr1::__detail::_Default_ranged_hash,_std::tr1::__detail::_Prime_rehash_policy,_false,_false,_true>
              ._M_bucket_count;
      p_Var12 = pp_Var3[uVar8 % uVar4];
      p_Var14 = (_Node *)0x0;
      if (p_Var12 != (_Node *)0x0) {
        do {
          iVar6 = strcmp(pcVar2,(p_Var12->_M_v).first);
          p_Var14 = p_Var12;
          if (iVar6 == 0) break;
          p_Var12 = p_Var12->_M_next;
          p_Var14 = (_Node *)0x0;
        } while (p_Var12 !=
                 (_Hash_node<std::pair<const_char_*const,_google::protobuf::(anonymous_namespace)::Symbol>,_false>
                  *)0x0);
      }
      if (p_Var14 == (_Node *)0x0) {
        p_Var14 = pp_Var3[uVar4];
      }
      pSVar9 = &(p_Var14->_M_v).second;
      if (p_Var14 == pp_Var3[uVar4]) {
        pSVar9 = (Symbol *)&(anonymous_namespace)::kNullSymbol;
      }
      aVar11 = (anon_union_8_7_bfa3a334_for_Symbol_2)(pSVar9->field_1).descriptor;
      TVar7 = pSVar9->type;
    }
    internal::MutexLockMaybe::~MutexLockMaybe(&local_48);
    SVar15._4_4_ = 0;
    SVar15.type = TVar7;
    SVar15.field_1.descriptor = aVar11.descriptor;
    return SVar15;
  }
LAB_001df4e9:
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                ,0x1e2,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
               );
}

Assistant:

Symbol DescriptorBuilder::FindSymbolNotEnforcingDepsHelper(
    const DescriptorPool* pool, const string& name) {
  // If we are looking at an underlay, we must lock its mutex_, since we are
  // accessing the underlay's tables_ directly.
  MutexLockMaybe lock((pool == pool_) ? NULL : pool->mutex_);

  Symbol result = pool->tables_->FindSymbol(name);
  if (result.IsNull() && pool->underlay_ != NULL) {
    // Symbol not found; check the underlay.
    result = FindSymbolNotEnforcingDepsHelper(pool->underlay_, name);
  }

  if (result.IsNull()) {
    // In theory, we shouldn't need to check fallback_database_ because the
    // symbol should be in one of its file's direct dependencies, and we have
    // already loaded those by the time we get here.  But we check anyway so
    // that we can generate better error message when dependencies are missing
    // (i.e., "missing dependency" rather than "type is not defined").
    if (pool->TryFindSymbolInFallbackDatabase(name)) {
      result = pool->tables_->FindSymbol(name);
    }
  }

  return result;
}